

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::AddCommand(Handler *this,string *command,Event *event)

{
  __hashtable *__h;
  __uniq_ptr_impl<Event,_std::default_delete<Event>_> local_40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>
  local_38;
  
  local_40._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
  super__Head_base<0UL,_Event_*,_false>._M_head_impl =
       (tuple<Event_*,_std::default_delete<Event>_>)
       (tuple<Event_*,_std::default_delete<Event>_>)event;
  std::__cxx11::string::string((string *)&local_38,(string *)command);
  local_40._M_t.super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
  super__Head_base<0UL,_Event_*,_false>._M_head_impl =
       (tuple<Event_*,_std::default_delete<Event>_>)
       (_Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>)0x0;
  local_38.second._M_t.super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
  super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.super__Head_base<0UL,_Event_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Event,_std::default_delete<Event>,_true,_true>)
       (__uniq_ptr_data<Event,_std::default_delete<Event>,_true,_true>)event;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>
  ::~pair(&local_38);
  std::unique_ptr<Event,_std::default_delete<Event>_>::~unique_ptr
            ((unique_ptr<Event,_std::default_delete<Event>_> *)&local_40);
  return;
}

Assistant:

void Handler::AddCommand(const std::string &command, Event* event) {
    m_Commands.insert({command, std::unique_ptr<Event>(event)});
}